

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall embree::ImageT<embree::Col4<float>_>::~ImageT(ImageT<embree::Col4<float>_> *this)

{
  ~ImageT(this);
  ::operator_delete(this);
  return;
}

Assistant:

virtual ~ImageT() {
      delete[] data; data = nullptr;
    }